

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_reader::add_component(jpeg_stream_reader *this,uint8_t component_id)

{
  bool bVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  uchar *local_30;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  uint8_t local_11;
  jpeg_stream_reader *pjStack_10;
  uint8_t component_id_local;
  jpeg_stream_reader *this_local;
  
  local_11 = component_id;
  pjStack_10 = this;
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                          (&this->component_ids_);
  local_30 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                                (&this->component_ids_);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
                       (local_28,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )local_30,&local_11);
  local_38._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                          (&this->component_ids_);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
  if (!bVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->component_ids_,&local_11);
    return;
  }
  impl::throw_jpegls_error(duplicate_component_id_in_sof_segment);
}

Assistant:

void jpeg_stream_reader::add_component(const uint8_t component_id)
{
    if (UNLIKELY(find(component_ids_.cbegin(), component_ids_.cend(), component_id) != component_ids_.cend()))
        throw_jpegls_error(jpegls_errc::duplicate_component_id_in_sof_segment);

    component_ids_.push_back(component_id);
}